

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportSet.cxx
# Opt level: O2

void __thiscall cmExportSet::~cmExportSet(cmExportSet *this)

{
  cmDeleteAll<std::vector<cmTargetExport*,std::allocator<cmTargetExport*>>>(&this->TargetExports);
  std::
  _Vector_base<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
  ::~_Vector_base(&(this->Installations).
                   super__Vector_base<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
                 );
  std::__cxx11::string::~string((string *)&this->Name);
  std::_Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::~_Vector_base
            ((_Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *)this);
  return;
}

Assistant:

cmExportSet::~cmExportSet()
{
  cmDeleteAll(this->TargetExports);
}